

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O0

vec_t ImGuizmo::Normalized(vec_t *v)

{
  vec_t vVar1;
  vec_t *v_local;
  vec_t res;
  
  v_local = *(vec_t **)v;
  res.x = v->z;
  res.y = v->w;
  vec_t::Normalize((vec_t *)&v_local);
  vVar1.z = res.x;
  vVar1.w = res.y;
  vVar1._0_8_ = v_local;
  return vVar1;
}

Assistant:

vec_t Normalized(const vec_t& v) { vec_t res; res = v; res.Normalize(); return res; }